

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O1

void __thiscall xray_re::xr_way_object::save_v12(xr_way_object *this,xr_ini_writer *w)

{
  _Rb_tree_header *p_Var1;
  pointer pwVar2;
  pointer pwVar3;
  xr_way_object *pxVar4;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  _Base_ptr p_Var8;
  size_t in_RCX;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  void *__buf;
  uint32_t id;
  ulong uVar11;
  way_link *link;
  pointer pwVar12;
  pointer point;
  bool bVar13;
  dict indices;
  char buffer [128];
  pair<unsigned_short,_unsigned_char> local_f4;
  xr_way_object *local_f0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  local_e8;
  char local_b8 [136];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  p_Var1 = &local_e8._M_impl.super__Rb_tree_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pwVar12 = (this->m_links).
            super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
            super__Vector_impl_data._M_start;
  pwVar2 = (this->m_links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = this;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pwVar12 != pwVar2) {
    do {
      p_Var8 = &p_Var1->_M_header;
      if (local_e8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var9 = local_e8._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          bVar13 = (ushort)*(size_t *)(p_Var9 + 1) < pwVar12->from;
          if (!bVar13) {
            p_Var8 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[bVar13];
        } while (p_Var9 != (_Base_ptr)0x0);
      }
      p_Var10 = p_Var1;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var10 = (_Rb_tree_header *)p_Var8,
         pwVar12->from < (ushort)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
        p_Var10 = p_Var1;
      }
      if (p_Var10 == p_Var1) {
        local_f4.first = pwVar12->from;
        local_f4.second = '\0';
        std::
        _Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_char>,std::_Select1st<std::pair<unsigned_short_const,unsigned_char>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
        ::_M_emplace_unique<std::pair<unsigned_short,unsigned_char>>
                  ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_char>,std::_Select1st<std::pair<unsigned_short_const,unsigned_char>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
                    *)&local_e8,&local_f4);
        uVar11 = 0;
      }
      else {
        bVar6 = *(undefined1 *)((long)&p_Var10->_M_node_count + 2) + 1;
        *(byte *)((long)&p_Var10->_M_node_count + 2) = bVar6;
        uVar11 = (ulong)bVar6;
      }
      in_RCX = (size_t)pwVar12->from;
      iVar7 = snprintf(local_b8,0x80,"link_wp_%d_%d",in_RCX,uVar11);
      if (0 < iVar7) {
        xr_ini_writer::write(w,(int)local_b8,__buf,in_RCX);
      }
      pwVar12 = pwVar12 + 1;
    } while (pwVar12 != pwVar2);
  }
  pxVar4 = local_f0;
  xr_ini_writer::write(w,0x1f274f,(void *)(ulong)local_f0->m_type,in_RCX);
  xr_ini_writer::write(w,0x1f3d25,(void *)0x13,in_RCX);
  point = (pxVar4->m_points).
          super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>._M_impl.
          super__Vector_impl_data._M_start;
  pwVar3 = (pxVar4->m_points).
           super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (point != pwVar3) {
    sVar5 = 0;
    do {
      in_RCX = sVar5;
      id = (uint32_t)in_RCX;
      write_point_ini::operator()((write_point_ini *)&local_f4,point,w,id);
      point = point + 1;
      sVar5 = (ulong)(id + 1);
    } while (point != pwVar3);
  }
  xr_ini_writer::write
            (w,0x1f2f05,
             (void *)(((long)(pxVar4->m_points).
                             super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pxVar4->m_points).
                             super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7),
             in_RCX);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&local_e8);
  return;
}

Assistant:

void xr_way_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	// write links
	char buffer[128];
	char* buf = &buffer[0];
	typedef std::map<uint16_t, uint8_t> dict;
	typedef std::pair<uint16_t, uint8_t> dict_pair;
	dict indices;
	fvector2 link_vector;
	link_vector.y = 1.0;

	way_link_vec_cit it = m_links.begin(), end = m_links.end();
	for (uint8_t id = 0; it != end; ++it) {
		way_link* link = (way_link *)&(*it);

		dict::iterator pair = indices.find(link->from);
		if (pair != indices.end())
			id = ++pair->second;
		else
			indices.insert(dict_pair(link->from, id = 0));

		int n = xr_snprintf(buf, sizeof(buffer), "link_wp_%d_%d", link->from, id);
		if (n > 0)
		{
			link_vector.x = link->to;
			link_vector.y = link->weight;
			w->write(buf, link_vector);
		}
	}

	w->write("type", this->m_type);
	w->write("version", WAYOBJECT_VERSION);

	// write waypoints

	w->w_ini_seq(this->m_points, write_point_ini());
	w->write("wp_count", this->m_points.size());
}